

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fTransformFeedbackTests.cpp
# Opt level: O3

void __thiscall
deqp::gles3::Functional::TransformFeedback::TransformFeedbackCase::~TransformFeedbackCase
          (TransformFeedbackCase *this)

{
  pointer puVar1;
  pointer piVar2;
  
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TransformFeedbackCase_00cfd7b0;
  deinit(this);
  puVar1 = (this->m_outputBuffers).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (puVar1 != (pointer)0x0) {
    operator_delete(puVar1,(long)(this->m_outputBuffers).
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)puVar1);
  }
  piVar2 = (this->m_bufferStrides).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (piVar2 != (pointer)0x0) {
    operator_delete(piVar2,(long)(this->m_bufferStrides).
                                 super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage - (long)piVar2);
  }
  std::
  vector<deqp::gles3::Functional::TransformFeedback::Output,_std::allocator<deqp::gles3::Functional::TransformFeedback::Output>_>
  ::~vector(&this->m_transformFeedbackOutputs);
  std::
  vector<deqp::gles3::Functional::TransformFeedback::Attribute,_std::allocator<deqp::gles3::Functional::TransformFeedback::Attribute>_>
  ::~vector(&this->m_attributes);
  ProgramSpec::~ProgramSpec(&this->m_progSpec);
  tcu::TestCase::~TestCase((TestCase *)this);
  return;
}

Assistant:

TransformFeedbackCase::~TransformFeedbackCase (void)
{
	TransformFeedbackCase::deinit();
}